

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.c
# Opt level: O2

void flip_bgr(sptr_t colors)

{
  uchar uVar1;
  long lVar2;
  uchar *puVar3;
  
  puVar3 = colors.ptr;
  for (lVar2 = 0; (int)lVar2 < (int)colors.size - (int)(colors.size % 3); lVar2 = lVar2 + 3) {
    uVar1 = puVar3[lVar2];
    puVar3[lVar2] = puVar3[lVar2 + 2];
    puVar3[lVar2 + 2] = uVar1;
  }
  return;
}

Assistant:

void flip_bgr(sptr_t colors)
{
	int i;
	int size = colors.size - (colors.size % 3);
	unsigned char *p = colors.ptr;
	for (i = 0; i < size; i += 3) {
		unsigned char tmp = *p;
		*p = *(p + 2);
		*(p + 2) = tmp;
		p += 3;
	}
}